

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O2

bool anon_unknown.dwarf_6e813::findPoint<double>
               (vector<int,_std::allocator<int>_> *data,vector<int,_std::allocator<int>_> *second,
               vector<double,_std::allocator<double>_> *edge,uint32_t leftSideOffset,
               uint32_t rightSideOffset,int minimumContrast,bool checkContrast,
               uint32_t leftSideContrastCheck,uint32_t rightSideContrastCheck,uint32_t position,
               uint32_t size)

{
  int iVar1;
  pointer piVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  int iVar6;
  ulong uVar7;
  uint32_t blackContrastEnd;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 in_ZMM2 [64];
  double local_50;
  float local_48;
  undefined1 extraout_var [60];
  
  auVar10 = in_ZMM2._0_16_;
  piVar2 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  _Var5 = std::
          __max_element<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar2 + leftSideOffset,piVar2 + (ulong)rightSideOffset + 1);
  piVar2 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar1 = *_Var5._M_current;
  _Var5 = std::
          __min_element<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar2 + leftSideOffset,piVar2 + (ulong)rightSideOffset + 1);
  if (iVar1 - *_Var5._M_current < minimumContrast) {
LAB_00115b32:
    bVar4 = false;
  }
  else {
    if ((checkContrast && leftSideContrastCheck <= position) &&
       (position + rightSideContrastCheck < size)) {
      piVar2 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      uVar7 = (ulong)(position + 1);
      local_48 = std::
                 accumulate<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,float>
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            )(piVar2 + (position - leftSideContrastCheck)),
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            )(piVar2 + (ulong)position + 1),0.0);
      piVar2 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      auVar9._0_4_ = std::
                     accumulate<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,float>
                               ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                 )(piVar2 + uVar7),
                                (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                 )(piVar2 + (ulong)(position + rightSideContrastCheck) + 1),0.0);
      auVar9._4_60_ = extraout_var;
      auVar3 = vinsertps_avx(auVar9._0_16_,ZEXT416((uint)local_48),0x10);
      auVar8 = vpinsrd_avx(ZEXT416(rightSideContrastCheck),leftSideContrastCheck + 1,1);
      auVar8 = vcvtudq2pd_avx512vl(auVar8);
      auVar3 = vcvtps2pd_avx(auVar3);
      auVar3 = vdivpd_avx(auVar3,auVar8);
      auVar3 = vhsubpd_avx(auVar3,auVar3);
      if (auVar3._0_8_ < (double)minimumContrast) goto LAB_00115b32;
    }
    else {
      if (checkContrast) goto LAB_00115b32;
      uVar7 = (ulong)(position + 1);
    }
    piVar2 = (second->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    iVar1 = piVar2[position];
    iVar6 = iVar1 - piVar2[uVar7];
    if (iVar6 == 0) {
      auVar10 = vcvtusi2ss_avx512f(auVar10,position);
      local_50 = (double)(auVar10._0_4_ + 0.5);
    }
    else {
      auVar10 = vcvtusi2sd_avx512f(auVar10,position);
      local_50 = (double)iVar1 / (double)iVar6 + auVar10._0_8_;
    }
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(edge,&local_50);
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool findPoint( const std::vector< int > & data, const std::vector< int > & second, std::vector< _Type > & edge,
                    uint32_t leftSideOffset, uint32_t rightSideOffset, int minimumContrast, bool checkContrast,
                    uint32_t leftSideContrastCheck, uint32_t rightSideContrastCheck, uint32_t position, uint32_t size )
    {
        const int maxIntensity = *(std::max_element( data.begin() + leftSideOffset, data.begin() + rightSideOffset + 1 ));
        const int minIntensity = *(std::min_element( data.begin() + leftSideOffset, data.begin() + rightSideOffset + 1 ));

        if ( maxIntensity - minIntensity < minimumContrast )
            return false;

        if ( checkContrast && leftSideContrastCheck <= position && (rightSideContrastCheck + position) < size ) {
            const uint32_t blackContrastEnd   = position;
            const uint32_t whiteContrastStart = position + 1;

            const uint32_t blackContrastStart = position - leftSideContrastCheck;
            const uint32_t whiteContrastEnd   = position + rightSideContrastCheck;

            _Type sumBlack = std::accumulate( data.begin() + blackContrastStart, data.begin() + blackContrastEnd + 1, 0.0f );
            _Type sumWhite = std::accumulate( data.begin() + whiteContrastStart, data.begin() + whiteContrastEnd + 1, 0.0f );

            sumBlack /= (blackContrastEnd - blackContrastStart + 1);
            sumWhite /= (whiteContrastEnd - whiteContrastStart + 1);

            if ( sumWhite - sumBlack >= minimumContrast )
                checkContrast = false;
        }

        if ( !checkContrast ) {
            if ( second[position] != second[position + 1] )
                edge.push_back( position + static_cast<_Type>(second[position]) / (second[position] - second[position + 1u]) );
            else
                edge.push_back( position + 0.5f );
            return true;
        }

        return false;
    }